

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

idx_t __thiscall duckdb::Transformer::ParamCount(Transformer *this)

{
  Transformer *pTVar1;
  Transformer *root;
  Transformer *in_stack_fffffffffffffff0;
  
  pTVar1 = RootTransformer(in_stack_fffffffffffffff0);
  return pTVar1->prepared_statement_parameter_index;
}

Assistant:

idx_t Transformer::ParamCount() const {
	auto &root = RootTransformer();
	return root.prepared_statement_parameter_index;
}